

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::Table
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this)

{
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  Vector<unsigned_int>::Vector((Vector<unsigned_int> *)this);
  TreeIndex<kj::_::(anonymous_namespace)::UintCompare>::TreeIndex
            ((TreeIndex<kj::_::(anonymous_namespace)::UintCompare> *)(this + 0x20));
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}